

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.h
# Opt level: O2

bool __thiscall
draco::PointCloudDecoder::SetAttributesDecoder
          (PointCloudDecoder *this,int att_decoder_id,
          unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
          *decoder)

{
  pointer puVar1;
  
  if (-1 < att_decoder_id) {
    puVar1 = (this->attributes_decoders_).
             super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->attributes_decoders_).
                            super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 3) <=
        att_decoder_id) {
      std::
      vector<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
      ::resize(&this->attributes_decoders_,(ulong)(att_decoder_id + 1));
      puVar1 = (this->attributes_decoders_).
               super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    std::
    __uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
    ::operator=((__uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                 *)(puVar1 + (uint)att_decoder_id),
                (__uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                 *)decoder);
  }
  return -1 < att_decoder_id;
}

Assistant:

bool SetAttributesDecoder(
      int att_decoder_id, std::unique_ptr<AttributesDecoderInterface> decoder) {
    if (att_decoder_id < 0) {
      return false;
    }
    if (att_decoder_id >= static_cast<int>(attributes_decoders_.size())) {
      attributes_decoders_.resize(att_decoder_id + 1);
    }
    attributes_decoders_[att_decoder_id] = std::move(decoder);
    return true;
  }